

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::GregorianCalendar::handleGetMonthLength
          (GregorianCalendar *this,int32_t extendedYear,int32_t month)

{
  UBool UVar1;
  int32_t iVar2;
  char local_21;
  int32_t local_18;
  int local_14;
  int32_t month_local;
  int32_t extendedYear_local;
  GregorianCalendar *this_local;
  
  local_18 = month;
  local_14 = extendedYear;
  _month_local = this;
  if ((month < 0) || (0xb < month)) {
    iVar2 = ClockMath::floorDivide((double)month,0xc,&local_18);
    local_14 = iVar2 + local_14;
  }
  UVar1 = isLeapYear(this,local_14);
  if (UVar1 == '\0') {
    local_21 = "\x1f\x1c\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f"[local_18];
  }
  else {
    local_21 = "\x1f\x1d\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f"[local_18];
  }
  return (int)local_21;
}

Assistant:

int32_t GregorianCalendar::handleGetMonthLength(int32_t extendedYear, int32_t month)  const
{
    // If the month is out of range, adjust it into range, and
    // modify the extended year value accordingly.
    if (month < 0 || month > 11) {
        extendedYear += ClockMath::floorDivide(month, 12, month);
    }

    return isLeapYear(extendedYear) ? kLeapMonthLength[month] : kMonthLength[month];
}